

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

QString * QLocale::languageToString(Language language)

{
  long lVar1;
  QLatin1StringView latin1;
  ushort in_SI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar2;
  QByteArrayView in_stack_00000000;
  QByteArrayView *in_stack_ffffffffffffffc0;
  qsizetype in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_SI < 0x15b) {
    QByteArrayView::QByteArrayView<const_char_*,_true>(in_stack_ffffffffffffffc0,(char **)in_RDI);
    QString::fromUtf8(in_stack_00000000);
  }
  else {
    QVar2 = Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,(size_t)in_RDI);
    latin1.m_data = in_stack_ffffffffffffffe8;
    latin1.m_size = in_stack_ffffffffffffffe0;
    QString::QString((QString *)QVar2.m_size,latin1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::languageToString(Language language)
{
    if (language > LastLanguage)
        return "Unknown"_L1;
    return QString::fromUtf8(language_name_list + language_name_index[language]);
}